

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_throw(lua_State *L,int errcode)

{
  StkId pTVar1;
  lua_State *plVar2;
  StkId pTVar3;
  TValue *io1;
  TValue *io2;
  int errcode_local;
  lua_State *L_local;
  
  if (L->errorJmp != (lua_longjmp *)0x0) {
    L->errorJmp->status = errcode;
    longjmp((__jmp_buf_tag *)L->errorJmp->b,1);
  }
  L->status = (lu_byte)errcode;
  if (L->l_G->mainthread->errorJmp != (lua_longjmp *)0x0) {
    pTVar1 = L->top;
    plVar2 = L->l_G->mainthread;
    pTVar3 = plVar2->top;
    plVar2->top = pTVar3 + 1;
    pTVar3->value_ = pTVar1[-1].value_;
    pTVar3->tt_ = pTVar1[-1].tt_;
    luaD_throw(L->l_G->mainthread,errcode);
  }
  if (L->l_G->panic != (lua_CFunction)0x0) {
    (*L->l_G->panic)(L);
  }
  abort();
}

Assistant:

l_noret luaD_throw (lua_State *L, int errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    L->status = cast_byte(errcode);  /* mark it as dead */
    if (G(L)->mainthread->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, G(L)->mainthread->top++, L->top - 1);  /* copy error obj. */
      luaD_throw(G(L)->mainthread, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (G(L)->panic) {  /* panic function? */
        lua_unlock(L);
        G(L)->panic(L);  /* call it (last chance to jump out) */
      }
      abort();
    }
  }
}